

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

char * Diligent::anon_unknown_25::ArchiveDeviceTypeToString(Uint32 dev)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  Uint32 dev_local;
  
  switch(dev) {
  case 0:
    pcStack_10 = "OpenGL";
    break;
  case 1:
    pcStack_10 = "Direct3D11";
    break;
  case 2:
    pcStack_10 = "Direct3D12";
    break;
  case 3:
    pcStack_10 = "Vulkan";
    break;
  case 4:
    pcStack_10 = "Metal for MacOS";
    break;
  case 5:
    pcStack_10 = "Metal for iOS";
    break;
  case 6:
    pcStack_10 = "WebGPU";
    break;
  default:
    msg.field_2._12_4_ = dev;
    FormatString<char[23]>((string *)local_38,(char (*) [23])"Unexpected device type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ArchiveDeviceTypeToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x139);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char* ArchiveDeviceTypeToString(Uint32 dev)
{
    using DeviceType = DeviceObjectArchive::DeviceType;
    static_assert(static_cast<Uint32>(DeviceType::Count) == 7, "Please handle the new archive device type below");
    switch (static_cast<DeviceType>(dev))
    {
            // clang-format off
        case DeviceType::OpenGL:      return "OpenGL";
        case DeviceType::Direct3D11:  return "Direct3D11";
        case DeviceType::Direct3D12:  return "Direct3D12";
        case DeviceType::Vulkan:      return "Vulkan";
        case DeviceType::Metal_MacOS: return "Metal for MacOS";
        case DeviceType::Metal_iOS:   return "Metal for iOS";
        case DeviceType::WebGPU:      return "WebGPU";
        // clang-format on
        default:
            UNEXPECTED("Unexpected device type");
            return "unknown";
    }
}